

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

subscriber_pointer __thiscall
pstore::brokerface::channel<std::condition_variable>::new_subscriber
          (channel<std::condition_variable> *this)

{
  subscriber<std::condition_variable> *this_00;
  pthread_mutex_t *in_RSI;
  subscriber<std::condition_variable> *local_30;
  not_null<pstore::brokerface::channel<std::condition_variable>_*> local_28;
  
  std::mutex::lock((mutex *)&in_RSI->__data);
  this_00 = (subscriber<std::condition_variable> *)operator_new(0x60);
  local_28.ptr_ = (channel<std::condition_variable> *)in_RSI;
  gsl::not_null<pstore::brokerface::channel<std::condition_variable>_*>::ensure_invariant(&local_28)
  ;
  subscriber<std::condition_variable>::subscriber(this_00,local_28);
  *(subscriber<std::condition_variable> **)&(this->mut_).super___mutex_base._M_mutex = this_00;
  local_30 = this_00;
  std::__detail::
  _Insert<pstore::brokerface::subscriber<std::condition_variable>_*,_pstore::brokerface::subscriber<std::condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<pstore::brokerface::subscriber<std::condition_variable>_*,_pstore::brokerface::subscriber<std::condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)((long)in_RSI + 0x30),&local_30);
  pthread_mutex_unlock(in_RSI);
  return (__uniq_ptr_data<pstore::brokerface::subscriber<std::condition_variable>,_std::default_delete<pstore::brokerface::subscriber<std::condition_variable>_>,_true,_true>
          )(__uniq_ptr_data<pstore::brokerface::subscriber<std::condition_variable>,_std::default_delete<pstore::brokerface::subscriber<std::condition_variable>_>,_true,_true>
            )this;
}

Assistant:

auto channel<ConditionVariable>::new_subscriber () -> subscriber_pointer {
            std::lock_guard<std::mutex> const lock{mut_};
            auto resl = subscriber_pointer{new subscriber_type (this)};
            subscribers_.insert (resl.get ());
            return resl;
        }